

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLeft2(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *eps,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec,int *idx,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *rhs,int *ridx,int rn,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *rhs2,int *ridx2,int rn2)

{
  int iVar1;
  int rhsn;
  long lVar2;
  uint *puVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  uint *puVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  byte bVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  uint local_2b0 [28];
  int local_240;
  undefined1 local_23c;
  undefined8 local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar7 = 0;
  if ((this->l).updateType == 0) {
    puVar3 = (uint *)eps;
    puVar5 = local_b0;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar5 = *puVar3;
      puVar3 = puVar3 + 1;
      puVar5 = puVar5 + 1;
    }
    local_40 = (eps->m_backend).exp;
    local_3c = (eps->m_backend).neg;
    local_38._0_4_ = (eps->m_backend).fpclass;
    local_38._4_4_ = (eps->m_backend).prec_elem;
    iVar1 = solveUpdateLeft(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_b0,rhs,ridx,rn);
    pnVar4 = eps;
    pnVar6 = &local_130;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar7 * -2 + 1) * 4);
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = (eps->m_backend).exp;
    local_130.m_backend.neg = (eps->m_backend).neg;
    local_130.m_backend.fpclass = (eps->m_backend).fpclass;
    local_130.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar1 = solveUleft(this,&local_130,vec,idx,rhs,ridx,iVar1);
    pnVar4 = eps;
    pnVar6 = &local_1b0;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar7 * -2 + 1) * 4);
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (eps->m_backend).exp;
    local_1b0.m_backend.neg = (eps->m_backend).neg;
    local_1b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_1b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rhsn = solveUpdateLeft(this,&local_1b0,rhs2,ridx2,rn2);
    pnVar4 = eps;
    pnVar6 = &local_230;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar7 * -2 + 1) * 4);
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = (eps->m_backend).exp;
    local_230.m_backend.neg = (eps->m_backend).neg;
    local_230.m_backend.fpclass = (eps->m_backend).fpclass;
    local_230.m_backend.prec_elem = (eps->m_backend).prec_elem;
    solveUleftNoNZ(this,&local_230,vec2,rhs2,ridx2,rhsn);
  }
  else {
    puVar3 = (uint *)eps;
    puVar5 = local_2b0;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar5 = *puVar3;
      puVar3 = puVar3 + 1;
      puVar5 = puVar5 + 1;
    }
    local_240 = (eps->m_backend).exp;
    local_23c = (eps->m_backend).neg;
    local_238._0_4_ = (eps->m_backend).fpclass;
    local_238._4_4_ = (eps->m_backend).prec_elem;
    iVar1 = solveUleft(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_2b0,vec,idx,rhs,ridx,rn);
    pnVar4 = eps;
    pnVar6 = &local_330;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar7 * -2 + 1) * 4);
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = (eps->m_backend).exp;
    local_330.m_backend.neg = (eps->m_backend).neg;
    local_330.m_backend.fpclass = (eps->m_backend).fpclass;
    local_330.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar1 = solveLleftForest(this,&local_330,vec,idx,iVar1);
    pnVar4 = eps;
    pnVar6 = &local_3b0;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar7 * -2 + 1) * 4);
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    local_3b0.m_backend.exp = (eps->m_backend).exp;
    local_3b0.m_backend.neg = (eps->m_backend).neg;
    local_3b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_3b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    solveUleftNoNZ(this,&local_3b0,vec2,rhs2,ridx2,rn2);
    solveLleftForestNoNZ(this,vec2);
  }
  pnVar4 = eps;
  pnVar6 = &local_430;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  local_430.m_backend.exp = (eps->m_backend).exp;
  local_430.m_backend.neg = (eps->m_backend).neg;
  local_430.m_backend.fpclass = (eps->m_backend).fpclass;
  local_430.m_backend.prec_elem = (eps->m_backend).prec_elem;
  iVar1 = solveLleft(this,&local_430,vec,idx,iVar1);
  solveLleftNoNZ(this,vec2);
  return iVar1;
}

Assistant:

int CLUFactor<R>::vSolveLeft2(R eps,
                              R* vec, int* idx,                      /* result */
                              R* rhs, int* ridx, int rn,             /* rhs    */
                              R* vec2,                               /* result2 */
                              R* rhs2, int* ridx2, int rn2)        /* rhs2    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      solveLleftForestNoNZ(vec2);
   }

   rn = solveLleft(eps, vec, idx, rn);

   solveLleftNoNZ(vec2);

   return rn;
}